

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

string * trim(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  string *extraout_RAX;
  string *psVar2;
  string *extraout_RAX_00;
  undefined4 extraout_var;
  string *extraout_RAX_01;
  long in_RDX;
  size_type sVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,s,(long)&(s->_M_dataplus)._M_p + in_RDX);
  sVar3 = __return_storage_ptr__->_M_string_length;
  psVar2 = extraout_RAX;
  if (sVar3 != 0) {
    iVar1 = isspace((int)*(__return_storage_ptr__->_M_dataplus)._M_p);
    while (iVar1 != 0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
      psVar2 = (string *)
               std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
        psVar2 = extraout_RAX_00;
      }
      sVar3 = __return_storage_ptr__->_M_string_length;
      if (sVar3 == 0) {
        return psVar2;
      }
      iVar1 = isspace((int)*(__return_storage_ptr__->_M_dataplus)._M_p);
    }
    do {
      iVar1 = isspace((int)(__return_storage_ptr__->_M_dataplus)._M_p[sVar3 - 1]);
      if (iVar1 == 0) {
        return (string *)CONCAT44(extraout_var,iVar1);
      }
      std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
      psVar2 = (string *)
               std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
        psVar2 = extraout_RAX_01;
      }
      sVar3 = __return_storage_ptr__->_M_string_length;
    } while (sVar3 != 0);
  }
  return psVar2;
}

Assistant:

static std::string trim(const std::string &s)
{
    std::string out = s;
    while (not out.empty() and std::isspace(out[0])) out = out.substr(1);
    while (not out.empty() and std::isspace(out[out.size()-1])) out = out.substr(0, out.size()-1);
    return out;
}